

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O0

void duckdb::GetIgnoredCodepoints
               (string_t ignored,
               unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
               *ignored_codepoints)

{
  uchar *puVar1;
  long lVar2;
  unsigned_long uVar3;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar4;
  utf8proc_int32_t codepoint;
  idx_t pos;
  idx_t size;
  utf8proc_uint8_t *dataptr;
  string_t *in_stack_ffffffffffffffb0;
  _Node_iterator_base<int,_false> in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  int local_34;
  ulong local_30;
  ulong local_28;
  char *local_20;
  string_t local_10;
  
  local_20 = string_t::GetData(in_stack_ffffffffffffffb0);
  local_28 = string_t::GetSize(&local_10);
  local_30 = 0;
  while (local_30 < local_28) {
    puVar1 = (uchar *)(local_20 + local_30);
    lVar2 = UnsafeNumericCast<long,unsigned_long,void>(local_28 - local_30);
    lVar2 = duckdb::utf8proc_iterate(puVar1,lVar2,&local_34);
    uVar3 = UnsafeNumericCast<unsigned_long,long,void>(lVar2);
    local_30 = uVar3 + local_30;
    pVar4 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
            insert((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
                   (value_type *)in_stack_ffffffffffffffb8._M_cur);
    in_stack_ffffffffffffffb8._M_cur =
         (__node_type *)pVar4.first.super__Node_iterator_base<int,_false>._M_cur;
    in_stack_ffffffffffffffc0 = pVar4.second;
  }
  return;
}

Assistant:

static void GetIgnoredCodepoints(string_t ignored, unordered_set<utf8proc_int32_t> &ignored_codepoints) {
	auto dataptr = reinterpret_cast<const utf8proc_uint8_t *>(ignored.GetData());
	auto size = ignored.GetSize();
	idx_t pos = 0;
	while (pos < size) {
		utf8proc_int32_t codepoint;
		pos += UnsafeNumericCast<idx_t>(
		    utf8proc_iterate(dataptr + pos, UnsafeNumericCast<utf8proc_ssize_t>(size - pos), &codepoint));
		ignored_codepoints.insert(codepoint);
	}
}